

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O1

IVec4 __thiscall
deqp::gles31::Functional::anon_unknown_1::getViewportBoundingBoxArea
          (anon_unknown_1 *this,ProjectedBBox *bbox,IVec2 *viewportSize,float size)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  undefined8 extraout_RDX;
  float fVar5;
  float fVar6;
  float fVar7;
  IVec4 IVar8;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  iVar3 = viewportSize->m_data[0];
  fVar6 = (bbox->min).m_data[1];
  iVar4 = viewportSize->m_data[1];
  fVar1 = (bbox->max).m_data[0];
  fVar2 = (bbox->max).m_data[1];
  fVar7 = size * 0.5;
  fVar5 = floorf(((bbox->min).m_data[0] * 0.5 + 0.5) * (float)iVar3 - fVar7);
  *(int *)this = (int)fVar5;
  fVar6 = floorf((fVar6 * 0.5 + 0.5) * (float)iVar4 - fVar7);
  *(int *)(this + 4) = (int)fVar6;
  fVar6 = ceilf((fVar1 * 0.5 + 0.5) * (float)iVar3 + fVar7);
  *(int *)(this + 8) = (int)fVar6;
  fVar6 = ceilf(fVar7 + (fVar2 * 0.5 + 0.5) * (float)iVar4);
  *(int *)(this + 0xc) = (int)fVar6;
  IVar8.m_data[2] = (int)extraout_RDX;
  IVar8.m_data[3] = (int)((ulong)extraout_RDX >> 0x20);
  IVar8.m_data._0_8_ = this;
  return (IVec4)IVar8.m_data;
}

Assistant:

static tcu::IVec4 getViewportBoundingBoxArea (const ProjectedBBox& bbox, const tcu::IVec2& viewportSize, float size = 0.0f)
{
	tcu::Vec4	vertexBox;
	tcu::IVec4	pixelBox;

	vertexBox.x() = (bbox.min.x() * 0.5f + 0.5f) * (float)viewportSize.x();
	vertexBox.y() = (bbox.min.y() * 0.5f + 0.5f) * (float)viewportSize.y();
	vertexBox.z() = (bbox.max.x() * 0.5f + 0.5f) * (float)viewportSize.x();
	vertexBox.w() = (bbox.max.y() * 0.5f + 0.5f) * (float)viewportSize.y();

	pixelBox.x() = deFloorFloatToInt32(vertexBox.x() - size/2.0f);
	pixelBox.y() = deFloorFloatToInt32(vertexBox.y() - size/2.0f);
	pixelBox.z() = deCeilFloatToInt32(vertexBox.z() + size/2.0f);
	pixelBox.w() = deCeilFloatToInt32(vertexBox.w() + size/2.0f);
	return pixelBox;
}